

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QMimeGlobPattern>::copyAppend
          (QGenericArrayOps<QMimeGlobPattern> *this,QMimeGlobPattern *b,QMimeGlobPattern *e)

{
  qsizetype *pqVar1;
  QMimeGlobPattern *pQVar2;
  long lVar3;
  Data *pDVar4;
  CaseSensitivity CVar5;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QMimeGlobPattern>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QMimeGlobPattern>).size;
      pDVar4 = (b->m_pattern).d.d;
      pQVar2[lVar3].m_pattern.d.d = pDVar4;
      pQVar2[lVar3].m_pattern.d.ptr = (b->m_pattern).d.ptr;
      pQVar2[lVar3].m_pattern.d.size = (b->m_pattern).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pDVar4 = (b->m_mimeType).d.d;
      pQVar2[lVar3].m_mimeType.d.d = pDVar4;
      pQVar2[lVar3].m_mimeType.d.ptr = (b->m_mimeType).d.ptr;
      pQVar2[lVar3].m_mimeType.d.size = (b->m_mimeType).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar2[lVar3].m_patternType = b->m_patternType;
      CVar5 = b->m_caseSensitivity;
      pQVar2[lVar3].m_weight = b->m_weight;
      pQVar2[lVar3].m_caseSensitivity = CVar5;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QMimeGlobPattern>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }